

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

MeasuredBRDF * pbrt::MeasuredBRDF::Create(string *filename,Allocator alloc)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer puVar4;
  pointer puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long *puVar10;
  ulong uVar11;
  float *pfVar12;
  size_type n;
  uchar *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  array<int,_3> aVar16;
  array<const_float_*,_2> aVar17;
  array<const_float_*,_2> aVar18;
  array<const_float_*,_3> aVar19;
  int iVar20;
  Field *pFVar21;
  Field *pFVar22;
  Field *pFVar23;
  Field *pFVar24;
  Field *pFVar25;
  undefined4 extraout_var;
  size_type sVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long in_FS_OFFSET;
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  int reduction;
  Tensor tf;
  undefined1 local_1c0 [176];
  Field *local_110;
  Field *local_108;
  Field *local_100;
  Field *local_f8;
  Field *local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  int local_e0;
  uchar *local_d8;
  uchar *puStack_d0;
  float *local_c8;
  uchar *local_b8;
  uchar *puStack_b0;
  uchar *local_a8;
  uchar *puStack_a0;
  Tensor local_90;
  MeasuredBRDF *this;
  
  Tensor::Tensor(&local_90,filename);
  pcVar1 = local_1c0 + 0x10;
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"theta_i","");
  pFVar21 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"phi_i","");
  pFVar22 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"ndf","");
  local_f0 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"sigma","");
  local_f8 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"vndf","");
  local_100 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"spectra","");
  local_110 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"luminance","");
  local_108 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"wavelengths","");
  pFVar23 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"description","");
  pFVar24 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"jacobian","");
  pFVar25 = Tensor::field(&local_90,(string *)local_1c0);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  if ((((((((long)(pFVar24->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pFVar24->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start == 8) && (pFVar24->dtype == UInt8)) &&
         (puVar4 = (pFVar21->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (long)(pFVar21->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 8)) &&
        ((pFVar21->dtype == Float32 &&
         (puVar5 = (pFVar22->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (long)(pFVar22->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 == 8)))) &&
       (pFVar22->dtype == Float32)) &&
      (((((puVar6 = (pFVar23->shape).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (long)(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 == 8 &&
          (pFVar23->dtype == Float32)) &&
         (((long)(local_f0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_f0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x10 &&
          (((local_f0->dtype == Float32 &&
            ((long)(local_f8->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_f8->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10)) && (local_f8->dtype == Float32))))))
        && ((puVar7 = (local_100->shape).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (long)(local_100->shape).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar7 == 0x20 &&
            (local_100->dtype == Float32)))) && (uVar8 = *puVar5, *puVar7 == uVar8)))) &&
     (((uVar9 = *puVar4, puVar7[1] == uVar9 &&
       (puVar7 = (local_108->shape).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
       (long)(local_108->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 == 0x20)) &&
      ((local_108->dtype == Float32 && ((*puVar7 == uVar8 && (puVar7[1] == uVar9)))))))) {
    if ((((puVar7[2] == puVar7[3]) &&
         ((((local_110->dtype == Float32 &&
            (puVar10 = (local_110->shape).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
            (long)(local_110->shape).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar10 == 0x28)) && (*puVar10 == uVar8)
           ) && ((puVar10[1] == uVar9 && (puVar10[2] == *puVar6)))))) &&
        ((puVar7[3] == puVar10[4] && ((puVar7[2] == puVar10[3] && (puVar10[3] == puVar10[4])))))) &&
       ((puVar4 = (pFVar25->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (long)(pFVar25->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 8 &&
        ((*puVar4 == 1 && (pFVar25->dtype == UInt8)))))) {
      iVar20 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x378,8);
      this = (MeasuredBRDF *)CONCAT44(extraout_var,iVar20);
      MeasuredBRDF(this,alloc);
      std::__cxx11::string::_M_assign((string *)&this->filename);
      uVar11 = *(pFVar22->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this->isotropic = uVar11 < 3;
      this->jacobian =
           *(pFVar25->data)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != '\0';
      if (2 < uVar11) {
        pfVar12 = (float *)(pFVar22->data)._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        auVar31 = ZEXT416((uint)(6.2831855 / ((pfVar12 + 0xffffffffffffffff)[uVar11] - *pfVar12)));
        auVar31 = vroundss_avx(auVar31,auVar31,4);
        local_1c0._0_4_ = (int)auVar31._0_4_;
        if ((int)auVar31._0_4_ != 1) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    ("%s: reduction %d (!= 1) not supported",filename,(int *)local_1c0);
        }
      }
      puVar4 = (local_f0->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      PiecewiseLinear2D<0UL>::PiecewiseLinear2D
                ((PiecewiseLinear2D<0UL> *)local_1c0,alloc.memoryResource,
                 (local_f0->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar4[1],
                 (int)*puVar4,0,0);
      PiecewiseLinear2D<0UL>::operator=
                ((PiecewiseLinear2D<0UL> *)this,(PiecewiseLinear2D<0UL> *)local_1c0);
      PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)local_1c0);
      puVar4 = (local_f8->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      PiecewiseLinear2D<0UL>::PiecewiseLinear2D
                ((PiecewiseLinear2D<0UL> *)local_1c0,alloc.memoryResource,
                 (local_f8->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar4[1],
                 (int)*puVar4,0,0);
      PiecewiseLinear2D<0UL>::operator=(&this->sigma,(PiecewiseLinear2D<0UL> *)local_1c0);
      PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)local_1c0);
      puVar4 = (local_100->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a8 = (pFVar22->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      puStack_a0 = (pFVar21->data)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      aVar17.values[1]._0_4_ = (int)puStack_a0;
      aVar17.values[0] = (float *)local_a8;
      aVar17.values[1]._4_4_ = (int)((ulong)puStack_a0 >> 0x20);
      PiecewiseLinear2D<2UL>::PiecewiseLinear2D
                ((PiecewiseLinear2D<2UL> *)local_1c0,alloc,
                 (float *)(local_100->data)._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar4[3]
                 ,(int)puVar4[2],
                 (array<int,_2>)
                 (*(pFVar21->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start << 0x20 |
                 (ulong)(uint)*(pFVar22->shape).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start),aVar17,true,true);
      PiecewiseLinear2D<2UL>::operator=(&this->vndf,(PiecewiseLinear2D<2UL> *)local_1c0);
      PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)local_1c0);
      puVar4 = (local_108->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_b8 = (pFVar22->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      puStack_b0 = (pFVar21->data)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      aVar18.values[1]._0_4_ = (int)puStack_b0;
      aVar18.values[0] = (float *)local_b8;
      aVar18.values[1]._4_4_ = (int)((ulong)puStack_b0 >> 0x20);
      PiecewiseLinear2D<2UL>::PiecewiseLinear2D
                ((PiecewiseLinear2D<2UL> *)local_1c0,alloc,
                 (float *)(local_108->data)._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar4[3]
                 ,(int)puVar4[2],
                 (array<int,_2>)
                 (*(pFVar21->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start << 0x20 |
                 (ulong)(uint)*(pFVar22->shape).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start),aVar18,true,true);
      PiecewiseLinear2D<2UL>::operator=(&this->luminance,(PiecewiseLinear2D<2UL> *)local_1c0);
      PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)local_1c0);
      n = *(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(&this->wavelengths,n);
      if (n != 0) {
        puVar13 = (pFVar23->data)._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        pfVar12 = (this->wavelengths).ptr;
        sVar26 = 0;
        do {
          pfVar12[sVar26] = *(float *)(puVar13 + sVar26 * 4);
          sVar26 = sVar26 + 1;
        } while (n != sVar26);
      }
      puVar4 = (local_110->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (undefined4)
              *(pFVar22->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = (undefined4)
              *(pFVar21->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_e0 = (int)*(pFVar23->shape).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
      _local_e8 = CONCAT44(uVar3,uVar2);
      local_d8 = (pFVar22->data)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      puStack_d0 = (pFVar21->data)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      local_c8 = (float *)(pFVar23->data)._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      aVar16.values[1] = uVar3;
      aVar16.values[0] = uVar2;
      aVar16.values[2] = local_e0;
      aVar19.values[1]._0_4_ = (int)puStack_d0;
      aVar19.values[0] = (float *)local_d8;
      aVar19.values[1]._4_4_ = (int)((ulong)puStack_d0 >> 0x20);
      aVar19.values[2] = local_c8;
      PiecewiseLinear2D<3UL>::PiecewiseLinear2D
                ((PiecewiseLinear2D<3UL> *)local_1c0,alloc,
                 (float *)(local_110->data)._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar4[4]
                 ,(int)puVar4[3],aVar16,aVar19,false,false);
      PiecewiseLinear2D<3UL>::operator=(&this->spectra,(PiecewiseLinear2D<3UL> *)local_1c0);
      PiecewiseLinear2D<3UL>::~PiecewiseLinear2D((PiecewiseLinear2D<3UL> *)local_1c0);
      lVar27 = ((this->vndf).m_marginal_cdf.nAlloc + (this->vndf).m_data.nAlloc +
               (this->vndf).m_conditional_cdf.nAlloc) * 4;
      lVar28 = 0;
      do {
        lVar27 = lVar27 + *(long *)((long)&((this->vndf).m_param_values.ptr)->nAlloc + lVar28);
        lVar28 = lVar28 + 0x20;
      } while (lVar28 == 0x20);
      lVar28 = ((this->luminance).m_marginal_cdf.nAlloc + (this->luminance).m_data.nAlloc +
               (this->luminance).m_conditional_cdf.nAlloc) * 4;
      lVar29 = 0;
      do {
        lVar28 = lVar28 + *(long *)((long)&((this->luminance).m_param_values.ptr)->nAlloc + lVar29);
        lVar29 = lVar29 + 0x20;
      } while (lVar29 == 0x20);
      vpmovsxbd_avx(ZEXT416(0x60402000));
      auVar30 = vpgatherdq_avx512vl(*(undefined4 *)
                                     ((long)&((this->spectra).m_param_values.ptr)->nAlloc + lVar28))
      ;
      auVar30._24_8_ = 0;
      auVar30 = vpaddq_avx2(auVar30,ZEXT832(((this->spectra).m_marginal_cdf.nAlloc +
                                             (this->spectra).m_data.nAlloc +
                                            (this->spectra).m_conditional_cdf.nAlloc) * 4));
      auVar15 = vpblendd_avx2(auVar30,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xc0);
      auVar31 = vpaddq_avx(auVar30._0_16_,auVar15._16_16_);
      auVar14 = vpshufd_avx(auVar31,0xee);
      auVar31 = vpaddq_avx(auVar31,auVar14);
      *(long *)(in_FS_OFFSET + -0x80) =
           *(long *)(in_FS_OFFSET + -0x80) +
           ((this->ndf).m_data.nAlloc + (this->wavelengths).nStored +
            (this->ndf).m_marginal_cdf.nAlloc + (this->ndf).m_conditional_cdf.nAlloc +
            (this->sigma).m_data.nAlloc + (this->sigma).m_marginal_cdf.nAlloc +
           (this->sigma).m_conditional_cdf.nAlloc) * 4 + 0x378 + lVar27 + lVar28 + auVar31._0_8_;
      goto LAB_003a2774;
    }
  }
  local_1c0._8_4_ = 0.0;
  local_1c0._12_4_ = 0.0;
  local_1c0[0x10] = '\0';
  local_1c0._0_8_ = pcVar1;
  detail::stringPrintfRecursive<std::__cxx11::string_const&,pbrt::Tensor&>
            ((string *)local_1c0,"%s: invalid BRDF file structure: %s",filename,&local_90);
  Error((FileLoc *)0x0,(char *)local_1c0._0_8_);
  if ((char *)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  this = (MeasuredBRDF *)0x0;
LAB_003a2774:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_filename._M_dataplus._M_p != &local_90.m_filename.field_2) {
    operator_delete(local_90.m_filename._M_dataplus._M_p,
                    local_90.m_filename.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_90);
  return this;
}

Assistant:

MeasuredBRDF *MeasuredBRDF::Create(const std::string &filename, Allocator alloc) {
    Tensor tf = Tensor(filename);
    auto &theta_i = tf.field("theta_i");
    auto &phi_i = tf.field("phi_i");
    auto &ndf = tf.field("ndf");
    auto &sigma = tf.field("sigma");
    auto &vndf = tf.field("vndf");
    auto &spectra = tf.field("spectra");
    auto &luminance = tf.field("luminance");
    auto &wavelengths = tf.field("wavelengths");
    auto &description = tf.field("description");
    auto &jacobian = tf.field("jacobian");

    if (!(description.shape.size() == 1 && description.dtype == Tensor::UInt8 &&

          theta_i.shape.size() == 1 && theta_i.dtype == Tensor::Float32 &&

          phi_i.shape.size() == 1 && phi_i.dtype == Tensor::Float32 &&

          wavelengths.shape.size() == 1 && wavelengths.dtype == Tensor::Float32 &&

          ndf.shape.size() == 2 && ndf.dtype == Tensor::Float32 &&

          sigma.shape.size() == 2 && sigma.dtype == Tensor::Float32 &&

          vndf.shape.size() == 4 && vndf.dtype == Tensor::Float32 &&
          vndf.shape[0] == phi_i.shape[0] && vndf.shape[1] == theta_i.shape[0] &&

          luminance.shape.size() == 4 && luminance.dtype == Tensor::Float32 &&
          luminance.shape[0] == phi_i.shape[0] &&
          luminance.shape[1] == theta_i.shape[0] &&
          luminance.shape[2] == luminance.shape[3] &&

          spectra.dtype == Tensor::Float32 && spectra.shape.size() == 5 &&
          spectra.shape[0] == phi_i.shape[0] && spectra.shape[1] == theta_i.shape[0] &&
          spectra.shape[2] == wavelengths.shape[0] &&
          spectra.shape[3] == spectra.shape[4] &&

          luminance.shape[2] == spectra.shape[3] &&
          luminance.shape[3] == spectra.shape[4] &&

          jacobian.shape.size() == 1 && jacobian.shape[0] == 1 &&
          jacobian.dtype == Tensor::UInt8)) {
        Error("%s: invalid BRDF file structure: %s", filename, tf);
        return nullptr;
    }

    MeasuredBRDF *brdf = alloc.new_object<MeasuredBRDF>(alloc);
    brdf->filename = filename;
    brdf->isotropic = phi_i.shape[0] <= 2;
    brdf->jacobian = ((uint8_t *)jacobian.data.get())[0];

    if (!brdf->isotropic) {
        float *phi_i_data = (float *)phi_i.data.get();
        int reduction =
            (int)std::rint((2 * Pi) / (phi_i_data[phi_i.shape[0] - 1] - phi_i_data[0]));
        if (reduction != 1)
            ErrorExit("%s: reduction %d (!= 1) not supported", filename, reduction);
    }

    /* Construct NDF interpolant data structure */
    brdf->ndf = Warp2D0(alloc, (float *)ndf.data.get(), ndf.shape[1], ndf.shape[0], {},
                        {}, false, false);

    /* Construct projected surface area interpolant data structure */
    brdf->sigma = Warp2D0(alloc, (float *)sigma.data.get(), sigma.shape[1],
                          sigma.shape[0], {}, {}, false, false);

    /* Construct VNDF warp data structure */
    brdf->vndf =
        Warp2D2(alloc, (float *)vndf.data.get(), vndf.shape[3], vndf.shape[2],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Construct Luminance warp data structure */
    brdf->luminance =
        Warp2D2(alloc, (float *)luminance.data.get(), luminance.shape[3],
                luminance.shape[2], {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Copy wavelength information */
    size_t size = wavelengths.shape[0];
    brdf->wavelengths.resize(size);
    for (size_t i = 0; i < size; ++i)
        brdf->wavelengths[i] = ((const float *)wavelengths.data.get())[i];

    /* Construct spectral interpolant */
    brdf->spectra =
        Warp2D3(alloc, (float *)spectra.data.get(), spectra.shape[4], spectra.shape[3],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0], (int)wavelengths.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get(),
                  (const float *)wavelengths.data.get()}},
                false, false);

    measuredBRDFBytes += sizeof(MeasuredBRDF) + 4 * brdf->wavelengths.size() +
                         brdf->ndf.BytesUsed() + brdf->sigma.BytesUsed() +
                         brdf->vndf.BytesUsed() + brdf->luminance.BytesUsed() +
                         brdf->spectra.BytesUsed();

    return brdf;
}